

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.hpp
# Opt level: O2

void __thiscall Map<String,_String>::~Map(Map<String,_String> *this)

{
  Item *this_00;
  ItemBlock *pIVar1;
  ItemBlock *pIVar2;
  Iterator *pIVar3;
  
  pIVar3 = &this->_begin;
  while (this_00 = pIVar3->item, this_00 != &this->endItem) {
    Item::~Item(this_00);
    pIVar3 = (Iterator *)&this_00->next;
  }
  pIVar2 = this->blocks;
  while (pIVar2 != (ItemBlock *)0x0) {
    pIVar1 = pIVar2->next;
    operator_delete__(pIVar2);
    pIVar2 = pIVar1;
  }
  Item::~Item(&this->endItem);
  return;
}

Assistant:

~Map()
  {
    for(Item* i = _begin.item, * end = &endItem; i != end; i = i->next)
      i->~Item();
    for(ItemBlock* i = blocks, * next; i; i = next)
    {
      next = i->next;
      delete[] (char*)i;
    }
  }